

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadedSharingTest::addBufferOperations(GLES2ThreadedSharingTest *this)

{
  EGLThread *pEVar1;
  pointer ppEVar2;
  CreateShader *pCVar3;
  ShaderSource *pSVar4;
  ShaderCompile *pSVar5;
  CreateProgram *this_00;
  AttachShader *pAVar6;
  LinkProgram *this_01;
  CreateBuffer *this_02;
  BufferData *pBVar7;
  BufferSubData *pBVar8;
  RenderBuffer *pRVar9;
  ReadPixels *pRVar10;
  CompareData *this_03;
  DeleteBuffer *pDVar11;
  DeleteShader *pDVar12;
  DeleteProgram *this_04;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> *pSVar13;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> buffer;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> program;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> fragmentShader;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> vertexShader;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;
  SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_1a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_198;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_188;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_178;
  SharedPtr<tcu::ThreadUtil::DataBlock> local_168;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_158;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_148;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_138;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_128;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_118;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_108;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_f8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_e8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Program> local_d8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_c8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_b8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_a8;
  SharedPtr<deqp::egl::GLES2ThreadTest::Shader> local_98;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_88;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_78;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_68;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_58;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_48;
  SharedPtr<deqp::egl::GLES2ThreadTest::Buffer> local_38;
  
  vertexShader.m_ptr = (Shader *)0x0;
  vertexShader.m_state = (SharedPtrStateBase *)0x0;
  fragmentShader.m_ptr = (Shader *)0x0;
  fragmentShader.m_state = (SharedPtrStateBase *)0x0;
  program.m_ptr = (Program *)0x0;
  program.m_state = (SharedPtrStateBase *)0x0;
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b31,&vertexShader,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_98.m_ptr = vertexShader.m_ptr;
    local_98.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_98,
               "attribute highp vec2 a_pos;\nvarying mediump vec2 v_pos;\nvoid main(void)\n{\n\tv_pos = a_pos;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_98);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    local_a8.m_ptr = vertexShader.m_ptr;
    local_a8.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_a8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_a8);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pCVar3 = (CreateShader *)operator_new(0x80);
    GLES2ThreadTest::CreateShader::CreateShader
              (pCVar3,0x8b30,&fragmentShader,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar3);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (ShaderSource *)operator_new(0x98);
    local_b8.m_ptr = fragmentShader.m_ptr;
    local_b8.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderSource::ShaderSource
              (pSVar4,&local_b8,
               "varying mediump vec2 v_pos;\nvoid main(void)\n{\n\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n}\n"
               ,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar4);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_b8);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (ShaderCompile *)operator_new(0x78);
    local_c8.m_ptr = fragmentShader.m_ptr;
    local_c8.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::ShaderCompile::ShaderCompile
              (pSVar5,&local_c8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pSVar5);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_c8);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_00 = (CreateProgram *)operator_new(0x78);
    GLES2ThreadTest::CreateProgram::CreateProgram
              (this_00,&program,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_00);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar6 = (AttachShader *)operator_new(0x88);
    local_d8.m_ptr = program.m_ptr;
    local_d8.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_e8.m_ptr = fragmentShader.m_ptr;
    local_e8.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar6,&local_d8,&local_e8,(this->m_config).useFenceSync,(this->m_config).serverSync)
    ;
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_e8);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_d8);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar6 = (AttachShader *)operator_new(0x88);
    local_f8.m_ptr = program.m_ptr;
    local_f8.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_108.m_ptr = vertexShader.m_ptr;
    local_108.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::AttachShader::AttachShader
              (pAVar6,&local_f8,&local_108,(this->m_config).useFenceSync,(this->m_config).serverSync
              );
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pAVar6);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_108);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_f8);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_01 = (LinkProgram *)operator_new(0x78);
    local_118.m_ptr = program.m_ptr;
    local_118.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::LinkProgram::LinkProgram
              (this_01,&local_118,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_01);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_118);
  }
  buffer.m_ptr = (Buffer *)0x0;
  buffer.m_state = (SharedPtrStateBase *)0x0;
  pEVar1 = *(this->m_threads).
            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_02 = (CreateBuffer *)operator_new(0x78);
  GLES2ThreadTest::CreateBuffer::CreateBuffer
            (this_02,&buffer,(this->m_config).useFenceSync,(this->m_config).serverSync);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_02);
  if ((this->m_config).define != 0) {
    if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
      pEVar1 = (this->m_threads).
               super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
               ._M_impl.super__Vector_impl_data._M_start[1];
      pBVar7 = (BufferData *)operator_new(0x90);
      local_48.m_ptr = buffer.m_ptr;
      local_48.m_state = buffer.m_state;
      if (buffer.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar13 = &local_48;
      GLES2ThreadTest::BufferData::BufferData
                (pBVar7,pSVar13,0x8892,0x400,0x88e8,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar7);
    }
    else {
      pEVar1 = *(this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar7 = (BufferData *)operator_new(0x90);
      local_38.m_ptr = buffer.m_ptr;
      local_38.m_state = buffer.m_state;
      if (buffer.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar13 = &local_38;
      GLES2ThreadTest::BufferData::BufferData
                (pBVar7,pSVar13,0x8892,0x400,0x88e8,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar7);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::release(pSVar13);
  }
  if ((this->m_config).modify != 0) {
    ppEVar2 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_config).render == true) {
      pEVar1 = *ppEVar2;
      pBVar8 = (BufferSubData *)operator_new(0x90);
      local_58.m_ptr = buffer.m_ptr;
      local_58.m_state = buffer.m_state;
      if (buffer.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar13 = &local_58;
      GLES2ThreadTest::BufferSubData::BufferSubData
                (pBVar8,pSVar13,0x8892,0x11,0x11,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar8);
    }
    else {
      pEVar1 = ppEVar2[1];
      pBVar8 = (BufferSubData *)operator_new(0x90);
      local_68.m_ptr = buffer.m_ptr;
      local_68.m_state = buffer.m_state;
      if (buffer.m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
        UNLOCK();
        LOCK();
        (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
        UNLOCK();
      }
      pSVar13 = &local_68;
      GLES2ThreadTest::BufferSubData::BufferSubData
                (pBVar8,pSVar13,0x8892,0x11,0x11,(this->m_config).useFenceSync,
                 (this->m_config).serverSync);
      tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pBVar8);
    }
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::release(pSVar13);
  }
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar9 = (RenderBuffer *)operator_new(0x88);
    local_128.m_ptr = program.m_ptr;
    local_128.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_138.m_ptr = buffer.m_ptr;
    local_138.m_state = buffer.m_state;
    if (buffer.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderBuffer::RenderBuffer
              (pRVar9,&local_128,&local_138,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::release(&local_138);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_128);
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar9 = (RenderBuffer *)operator_new(0x88);
    local_148.m_ptr = program.m_ptr;
    local_148.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_158.m_ptr = buffer.m_ptr;
    local_158.m_state = buffer.m_state;
    if (buffer.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::RenderBuffer::RenderBuffer
              (pRVar9,&local_148,&local_158,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar9);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::release(&local_158);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_148);
    pixels1.m_ptr = (DataBlock *)0x0;
    pixels1.m_state = (SharedPtrStateBase *)0x0;
    pixels2.m_ptr = (DataBlock *)0x0;
    pixels2.m_state = (SharedPtrStateBase *)0x0;
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar10 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar10,0,0,400,400,0x1908,0x1401,&pixels1,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar10);
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pRVar10 = (ReadPixels *)operator_new(0x90);
    GLES2ThreadTest::ReadPixels::ReadPixels
              (pRVar10,0,0,400,400,0x1908,0x1401,&pixels2,(this->m_config).useFenceSync,
               (this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pRVar10);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_03 = (CompareData *)operator_new(0x58);
    local_168.m_ptr = pixels1.m_ptr;
    local_168.m_state = pixels1.m_state;
    if (pixels1.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels1.m_state)->strongRefCount = (pixels1.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels1.m_state)->weakRefCount = (pixels1.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_178.m_ptr = pixels2.m_ptr;
    local_178.m_state = pixels2.m_state;
    if (pixels2.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (pixels2.m_state)->strongRefCount = (pixels2.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (pixels2.m_state)->weakRefCount = (pixels2.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    tcu::ThreadUtil::CompareData::CompareData(this_03,&local_168,&local_178);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_03);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&local_178);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&local_168);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&pixels2);
    de::SharedPtr<tcu::ThreadUtil::DataBlock>::release(&pixels1);
  }
  if (((this->m_config).modify == 0) && ((this->m_config).render != true)) {
    pEVar1 = (this->m_threads).
             super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
             ._M_impl.super__Vector_impl_data._M_start[1];
    pDVar11 = (DeleteBuffer *)operator_new(0x78);
    local_88.m_ptr = buffer.m_ptr;
    local_88.m_state = buffer.m_state;
    if (buffer.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar13 = &local_88;
    GLES2ThreadTest::DeleteBuffer::DeleteBuffer
              (pDVar11,pSVar13,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar11);
  }
  else {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar11 = (DeleteBuffer *)operator_new(0x78);
    local_78.m_ptr = buffer.m_ptr;
    local_78.m_state = buffer.m_state;
    if (buffer.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (buffer.m_state)->strongRefCount = (buffer.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (buffer.m_state)->weakRefCount = (buffer.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    pSVar13 = &local_78;
    GLES2ThreadTest::DeleteBuffer::DeleteBuffer
              (pDVar11,pSVar13,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar11);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::release(pSVar13);
  if ((this->m_config).render == true) {
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar12 = (DeleteShader *)operator_new(0x78);
    local_188.m_ptr = vertexShader.m_ptr;
    local_188.m_state = vertexShader.m_state;
    if (vertexShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (vertexShader.m_state)->strongRefCount = (vertexShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (vertexShader.m_state)->weakRefCount = (vertexShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar12,&local_188,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_188);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pDVar12 = (DeleteShader *)operator_new(0x78);
    local_198.m_ptr = fragmentShader.m_ptr;
    local_198.m_state = fragmentShader.m_state;
    if (fragmentShader.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (fragmentShader.m_state)->strongRefCount = (fragmentShader.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (fragmentShader.m_state)->weakRefCount = (fragmentShader.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteShader::DeleteShader
              (pDVar12,&local_198,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&local_198);
    pEVar1 = *(this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    this_04 = (DeleteProgram *)operator_new(0x78);
    local_1a8.m_ptr = program.m_ptr;
    local_1a8.m_state = program.m_state;
    if (program.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (program.m_state)->strongRefCount = (program.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (program.m_state)->weakRefCount = (program.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    GLES2ThreadTest::DeleteProgram::DeleteProgram
              (this_04,&local_1a8,(this->m_config).useFenceSync,(this->m_config).serverSync);
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)this_04);
    de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&local_1a8);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Buffer>::release(&buffer);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::release(&program);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&fragmentShader);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::release(&vertexShader);
  return;
}

Assistant:

void GLES2ThreadedSharingTest::addBufferOperations (void)
{
	// Add operations for verify
	SharedPtr<GLES2ThreadTest::Shader>	vertexShader;
	SharedPtr<GLES2ThreadTest::Shader>	fragmentShader;
	SharedPtr<GLES2ThreadTest::Program>	program;

	if (m_config.render)
	{
		const char* vertexShaderSource =
		"attribute highp vec2 a_pos;\n"
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tv_pos = a_pos;\n"
		"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
		"}\n";

		const char* fragmentShaderSource =
		"varying mediump vec2 v_pos;\n"
		"void main(void)\n"
		"{\n"
		"\tgl_FragColor = vec4(v_pos, 0.5, 1.0);\n"
		"}\n";

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_VERTEX_SHADER, vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(vertexShader, vertexShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateShader(GL_FRAGMENT_SHADER, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderSource(fragmentShader, fragmentShaderSource, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::ShaderCompile(fragmentShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::CreateProgram(program, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::AttachShader(program, vertexShader, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new GLES2ThreadTest::LinkProgram(program, m_config.useFenceSync, m_config.serverSync));
	}

	SharedPtr<GLES2ThreadTest::Buffer> buffer;

	m_threads[0]->addOperation(new GLES2ThreadTest::CreateBuffer(buffer, m_config.useFenceSync, m_config.serverSync));

	if (m_config.define)
	{
		if (m_config.modify || m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::BufferData(buffer, GL_ARRAY_BUFFER, 1024, GL_DYNAMIC_DRAW, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::BufferData(buffer, GL_ARRAY_BUFFER, 1024, GL_DYNAMIC_DRAW, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.modify)
	{
		if (m_config.render)
			m_threads[0]->addOperation(new GLES2ThreadTest::BufferSubData(buffer, GL_ARRAY_BUFFER, 17, 17, m_config.useFenceSync, m_config.serverSync));
		else
			m_threads[1]->addOperation(new GLES2ThreadTest::BufferSubData(buffer, GL_ARRAY_BUFFER, 17, 17, m_config.useFenceSync, m_config.serverSync));
	}

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::RenderBuffer(program, buffer, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::RenderBuffer(program, buffer, m_config.useFenceSync, m_config.serverSync));

		SharedPtr<tcu::ThreadUtil::DataBlock> pixels1;
		SharedPtr<tcu::ThreadUtil::DataBlock> pixels2;

		m_threads[0]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels1, m_config.useFenceSync, m_config.serverSync));
		m_threads[1]->addOperation(new GLES2ThreadTest::ReadPixels(0, 0, 400, 400, GL_RGBA, GL_UNSIGNED_BYTE, pixels2, m_config.useFenceSync, m_config.serverSync));

		m_threads[0]->addOperation(new tcu::ThreadUtil::CompareData(pixels1, pixels2));
	}

	if (m_config.modify || m_config.render)
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteBuffer(buffer, m_config.useFenceSync, m_config.serverSync));
	else
		m_threads[1]->addOperation(new GLES2ThreadTest::DeleteBuffer(buffer, m_config.useFenceSync, m_config.serverSync));

	if (m_config.render)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(vertexShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteShader(fragmentShader, m_config.useFenceSync, m_config.serverSync));
		m_threads[0]->addOperation(new GLES2ThreadTest::DeleteProgram(program, m_config.useFenceSync, m_config.serverSync));
	}
}